

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coder.h
# Opt level: O0

void __thiscall Encoder::put8(Encoder *this,uchar v)

{
  size_t sVar1;
  ostream *poVar2;
  S2LogMessage local_28;
  S2LogMessageVoidify local_12;
  uchar local_11;
  Encoder *pEStack_10;
  uchar v_local;
  Encoder *this_local;
  
  local_11 = v;
  pEStack_10 = this;
  sVar1 = avail(this);
  if (sVar1 != 0) {
    *this->buf_ = local_11;
    this->buf_ = this->buf_ + 1;
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
             ,0x1d4,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_28);
  poVar2 = std::operator<<(poVar2,"Check failed: (avail()) >= (sizeof(v)) ");
  S2LogMessageVoidify::operator&(&local_12,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
}

Assistant:

inline void Encoder::put8(unsigned char v) {
  S2_DCHECK_GE(avail(), sizeof(v));
  *buf_ = v;
  buf_ += sizeof(v);
}